

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*u) [2];
  char (*in_R8) [2];
  string sStack_38;
  
  (anonymous_namespace)::CWriter::
  Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,&(decl->sig).result_types,(char (*) [2])name,in_RCX,in_R8);
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&sStack_38,(CWriter *)this);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string,char_const(&)[2]>
            ((CWriter *)this,&sStack_38,u);
  std::__cxx11::string::_M_dispose();
  WriteParamTypes(this,decl);
  WriteData(this,")",1);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(decl.sig.result_types, " ", name, "(");
  Write(ModuleInstanceTypeName(), "*");
  WriteParamTypes(decl);
  Write(")");
}